

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O2

int google::protobuf::internal::MapFieldStateTest_SwapMapDirty_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<google::protobuf::internal::MapFieldStateTest> *this_01;
  char *test_base_name;
  CodeLocation *in_R8;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  _func_int **local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  undefined8 uStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  char local_90 [8];
  undefined8 uStack_88;
  TestMetaFactoryBase<std::tuple<google::protobuf::internal::(anonymous_namespace)::State,_bool>_>
  local_80;
  undefined8 local_78;
  _func_int *local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  CodeLocation local_58;
  string local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"MapFieldStateTest",&local_c1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field_test.cc"
             ,&local_c2);
  local_58.file._M_string_length = local_98;
  local_58.file._M_dataplus._M_p = (pointer)&local_58.file.field_2;
  if (local_a0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90) {
    local_58.file.field_2._8_8_ = uStack_88;
  }
  else {
    local_58.file._M_dataplus._M_p = (pointer)local_a0;
  }
  local_98 = 0;
  local_90[0] = '\0';
  local_58.line = 0x160;
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_90;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<google::protobuf::internal::MapFieldStateTest>
                      (this_00,&local_30,&local_58);
  test_base_name = (char *)operator_new(8);
  *(undefined ***)test_base_name = &PTR__TestMetaFactoryBase_0161a578;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field_test.cc"
             ,&local_c3);
  local_78 = local_b8;
  local_80._vptr_TestMetaFactoryBase = &local_70;
  if (local_c0 == (_func_int **)local_b0) {
    uStack_68 = uStack_a8;
  }
  else {
    local_80._vptr_TestMetaFactoryBase = local_c0;
  }
  local_b8 = 0;
  local_b0[0] = 0;
  local_60 = 0x160;
  local_c0 = (_func_int **)local_b0;
  testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::MapFieldStateTest>::
  AddTestPattern(this_01,"SwapMapDirty",test_base_name,&local_80,in_R8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

TEST_P(MapFieldStateTest, SwapMapDirty) {
  ArenaHolder<MapFieldType> other(arena_.get());
  MakeMapDirty(other.get());

  map_field_->Swap(other.get());

  Expect(map_field_.get(), MAP_DIRTY, 1, 0);

  switch (state_) {
    case CLEAN:
      Expect(other.get(), CLEAN, 1, 1);
      break;
    case MAP_DIRTY:
      Expect(other.get(), MAP_DIRTY, 1, 0);
      break;
    case REPEATED_DIRTY:
      Expect(other.get(), REPEATED_DIRTY, 0, 1);
      break;
    default:
      break;
  }
}